

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mine.hpp
# Opt level: O3

void __thiscall Mine::~Mine(Mine *this)

{
  ~Mine(this);
  operator_delete(this,0xe8);
  return;
}

Assistant:

virtual ~Mine() {}